

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  SwinTransformer<float> *this;
  Tensor<float> output;
  Tensor<float> input;
  array<int,_4UL> local_20;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Test Tiny Swin Transformer: ",0x1c);
  std::ostream::flush();
  this = (SwinTransformer<float> *)operator_new(0x1c8);
  output.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x200000002;
  output.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x200000006;
  local_20._M_elems[0] = 3;
  local_20._M_elems[1] = 6;
  local_20._M_elems[2] = 0xc;
  local_20._M_elems[3] = 0x18;
  input.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x200000004;
  input.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x200000002;
  shift_window_transformer::SwinTransformer<float>::SwinTransformer
            (this,(array<int,_4UL> *)&output,&local_20,0x60,3,1000,0x20,7,(array<int,_4UL> *)&input,
             true);
  shift_window_transformer::Tensor<float>::Tensor(&input,0x24c00,0.0);
  output.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0xe000000003;
  output.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(output.super_vector<float,_std::allocator<float>_>.
                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish._4_4_,0xe0);
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&input.shape,&output);
  output.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  output.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  output.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  output.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  output.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  output.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (*(code *)**(undefined8 **)this)(this,&input);
  *(undefined ***)this = &PTR_forward_0010b998;
  shift_window_transformer::Linear<float>::~Linear(&this->linear);
  shift_window_transformer::StageModule<float>::~StageModule(&this->stage4);
  shift_window_transformer::StageModule<float>::~StageModule(&this->stage3);
  shift_window_transformer::StageModule<float>::~StageModule(&this->stage2);
  shift_window_transformer::StageModule<float>::~StageModule(&this->stage1);
  operator_delete(this,0x1c8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  if (output.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(output.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)output.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)output.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (output.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(output.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)output.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)output.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (input.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(input.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)input.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)input.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (input.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(input.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)input.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)input.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
    /*
     * Test Swin Transformer
     */
    try {
        std::cout << "Test Tiny Swin Transformer: ";
        std::cout.flush();
        auto *swin_t = new shift_window_transformer::SwinTransformer<data_t>(
                96, std::array<int, 4>{2, 2, 6, 2},
                std::array<int, 4>{3, 6, 12, 24});
        shift_window_transformer::Tensor<data_t> input(3 * 224 * 224, 0);
        input.shape = {3, 224, 224};
        shift_window_transformer::Tensor<data_t> output{};
        swin_t->forward(input, output);
        delete swin_t;
        std::cout << "Ok" << std::endl;
    } catch (...) {
        std::cout << "Error" << std::endl;
    }
    return 0;
}